

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

LinearIndex * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_linearindex(NearestNeighborsIndex *this)

{
  LinearIndex *this_00;
  
  if (this->_oneof_case_[0] == 100) {
    this_00 = (this->IndexType_).linearindex_;
  }
  else {
    clear_IndexType(this);
    this->_oneof_case_[0] = 100;
    this_00 = (LinearIndex *)operator_new(0x18);
    LinearIndex::LinearIndex(this_00);
    (this->IndexType_).linearindex_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LinearIndex* NearestNeighborsIndex::mutable_linearindex() {
  if (!has_linearindex()) {
    clear_IndexType();
    set_has_linearindex();
    IndexType_.linearindex_ = new ::CoreML::Specification::LinearIndex;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.linearIndex)
  return IndexType_.linearindex_;
}